

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O0

void prindatum(LispPTR x)

{
  int iVar1;
  DLword *pDVar2;
  uint uVar3;
  LispPTR LVar4;
  LispPTR *pLVar5;
  uint *puVar6;
  LispPTR typename;
  int typen;
  dtd *dtd_base;
  NEWSTRINGP *newstring;
  LispPTR x_local;
  
  if (Printdepth < PrintMaxLevel) {
    newstring._4_4_ = x & 0xfffffff;
    uVar3 = *(ushort *)((ulong)(MDStypetbl + (newstring._4_4_ >> 9)) ^ 2) & 0x7ff;
    switch(uVar3) {
    case 1:
      if ((x & 0xfff0000) == 0xe0000) {
        printf("%d",(ulong)(x & 0xffff));
      }
      else {
        printf("%d",(ulong)(x & 0xffff | 0xffff0000));
      }
      break;
    case 2:
      print_fixp(newstring._4_4_);
      break;
    case 3:
      print_floatp(newstring._4_4_);
      break;
    case 4:
    case 0x15:
      print_atomname(newstring._4_4_);
      break;
    case 5:
      Printdepth = Printdepth + 1;
      PrintLen[Printdepth] = 0;
      printf("%c",0x28);
      while (iVar1 = PrintLen[Printdepth], PrintLen[Printdepth] = iVar1 + 1, iVar1 <= PrintMaxLen) {
        LVar4 = car(newstring._4_4_);
        prindatum(LVar4);
        pDVar2 = MDStypetbl;
        LVar4 = cdr(newstring._4_4_);
        if ((*(ushort *)((ulong)(pDVar2 + (LVar4 >> 9)) ^ 2) & 0x7ff) != 5) {
          LVar4 = cdr(newstring._4_4_);
          if (LVar4 != 0) {
            printf(" . ");
            prindatum(LVar4);
          }
          printf("%c",0x29);
          Printdepth = Printdepth + -1;
          return;
        }
        printf("%c",0x20);
        newstring._4_4_ = cdr(newstring._4_4_);
      }
      printf("%c",0x29);
      Printdepth = Printdepth + -1;
      break;
    default:
      puVar6 = (uint *)(DTDspace + (long)(int)(uVar3 << 4) + (long)(int)(uVar3 << 1));
      printf("{");
      if ((*puVar6 & 0xfffffff) == 0) {
        printf("unknown");
      }
      else {
        print_atomname(*puVar6 & 0xfffffff);
      }
      printf("}0x");
      printf("%x",(ulong)newstring._4_4_);
      break;
    case 7:
      print_string(newstring._4_4_);
      break;
    case 0xe:
    case 0x10:
      pLVar5 = NativeAligned4FromLAddr(newstring._4_4_);
      if ((*(ushort *)((long)pLVar5 + 6) >> 0xc & 1) != 0) {
        print_NEWstring(newstring._4_4_);
      }
    }
  }
  else if (Printdepth == PrintMaxLevel) {
    if ((*(ushort *)((ulong)(MDStypetbl + (x >> 9)) ^ 2) & 0x7ff) == 5) {
      printf("(-)");
    }
    else {
      printf("*");
    }
  }
  return;
}

Assistant:

void prindatum(LispPTR x) {
  NEWSTRINGP *newstring;
  struct dtd *dtd_base;
  int typen;
  LispPTR typename;

  if (Printdepth >= PrintMaxLevel) {
    if (Printdepth == PrintMaxLevel) {
      if (GetTypeNumber(x) == TYPE_LISTP) {
        printf("(-)");
      } else
        printf("*");
    }
    return;
  }

  x = x & POINTERMASK;
  switch (typen = GetTypeNumber(x)) {
    case TYPE_LITATOM:
#ifdef BIGATOMS
    case TYPE_NEWATOM:
#endif /* BIGATOMS */
      print_atomname(x);
      break;
    case TYPE_LISTP:
      Printdepth++;
      PrintLen[Printdepth] = 0;
      printf("%c", LEFT_PAREN); /* print "(" */
    lp:
      if (PrintLen[Printdepth]++ > PrintMaxLen) {
        printf("%c", RIGHT_PAREN);
        Printdepth--;
        break;
      }
      prindatum(car(x));
      if (Listp(cdr(x)) == 0) { /* print dotted pair */
        if ((x = cdr(x)) != NIL) {
          printf(" . ");
          prindatum(x);
        }
      } else {
        printf("%c", SPACE);
        x = cdr(x);
        goto lp;
      }
      printf("%c", RIGHT_PAREN); /* print ")" */
      Printdepth--;
      break;

    case TYPE_SMALLP:
      if ((x & SEGMASK) == S_POSITIVE)
        printf("%d", LOLOC(x)); /* print positive smallp */
      else
        printf("%d", (LOLOC(x) | 0xffff0000)); /* print negative smallp */
      break;
    case TYPE_FIXP:
      print_fixp(x); /* print fixp  */
      break;
    case TYPE_FLOATP: print_floatp(x); break;
    case TYPE_STRINGP:
      print_string(x); /* print string */
      break;
    case TYPE_ONED_ARRAY:
    case TYPE_GENERAL_ARRAY:
      newstring = (NEWSTRINGP *)NativeAligned4FromLAddr(x);
      if (newstring->stringp) {
        print_NEWstring(x);
      }
      break;
    default: dtd_base = (struct dtd *)GetDTD(typen); printf("{");
#ifdef BIGVM
      if ((typename = dtd_base->dtd_name) != 0)
#else
      if ((typename = dtd_base->dtd_namelo + (dtd_base->dtd_namehi << 16)) != 0)
#endif
        print_atomname(typename);
      else
        printf("unknown");
      printf("}0x");
      printf("%x", x); /* print lisp address in hex */
  }
}